

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

void __thiscall CentralBroker::create(CentralBroker *this,char *endP)

{
  int iVar1;
  long *__nptr;
  _Bool _Var2;
  bool bVar3;
  zactor_t *pzVar4;
  zrex_t *self;
  char *__s;
  char *pcVar5;
  int *piVar6;
  long lVar7;
  BrokerClient *this_00;
  undefined8 uVar8;
  zrex_t *addr_rex;
  allocator local_61;
  zrex_t *local_60;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  
  this->initialized = false;
  pcVar5 = (char *)(this->endpoint)._M_string_length;
  strlen(endP);
  std::__cxx11::string::_M_replace((ulong)&this->endpoint,0,pcVar5,(ulong)endP);
  pzVar4 = zactor_new(mlm_server,(void *)0x0);
  this->broker = pzVar4;
  zsock_send(pzVar4,"ss","BIND",(this->endpoint)._M_dataplus._M_p);
  zsock_send(this->broker,"sss","SET","server/timeout","5000");
  self = zrex_new("(.*):(\\d*)");
  local_60 = self;
  _Var2 = zrex_matches(self,endP);
  if (!_Var2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Error: Could not start broker handle. (CentralBroker::CentralBroker)\n",0x45);
  }
  __s = zrex_hit(self,1);
  pcVar5 = (char *)(this->address)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&this->address,0,pcVar5,(ulong)__s);
  pcVar5 = zrex_hit(self,2);
  std::__cxx11::string::string((string *)local_58,pcVar5,&local_61);
  __nptr = local_58[0];
  piVar6 = __errno_location();
  iVar1 = *piVar6;
  *piVar6 = 0;
  lVar7 = strtol((char *)__nptr,(char **)&local_38,10);
  if (local_38 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar7 == lVar7) && (*piVar6 != 0x22)) {
    if (*piVar6 == 0) {
      *piVar6 = iVar1;
    }
    this->port = (int)lVar7;
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    zrex_destroy(&local_60);
    this_00 = (BrokerClient *)operator_new(0x130);
    BrokerClient::BrokerClient
              (this_00,"Broker",(this->address)._M_dataplus._M_p,this->port,this->broker);
    this->brokerHandle = this_00;
    bVar3 = BrokerClient::start(this_00);
    if (bVar3) {
      pzVar4 = zactor_new(logging_reactor_task,this);
      this->logger = pzVar4;
      this->initialized = true;
    }
    return;
  }
  uVar8 = std::__throw_out_of_range("stoi");
  operator_delete(piVar6,0x130);
  _Unwind_Resume(uVar8);
}

Assistant:

void CentralBroker::create(const char *endP){
    initialized = false;
    endpoint.assign(endP);

    broker = zactor_new(mlm_server, NULL);

    //Bind broker to endpoint
    zsock_send(broker, "ss", "BIND", endpoint.c_str());
    //Set server timeouts to be 5000 ms
    zsock_send (broker, "sss", "SET", "server/timeout", "5000");

    //group 1 = anything before the colon, address
    //group 2 = any number of digits after colon, port
    zrex_t *addr_rex = zrex_new("(.*):(\\d*)");
    if(!zrex_matches(addr_rex, endP)){
        std::cout << "Error: Could not start broker handle. (CentralBroker::CentralBroker)\n";
    }
    address.assign(zrex_hit(addr_rex, 1));
    port = std::stoi(zrex_hit(addr_rex, 2));
    zrex_destroy(&addr_rex);

    //Start broker client
    brokerHandle = new BrokerClient(BROKER_NETWORK_ID, address.c_str(), port, broker);
    if(!brokerHandle->start()){
        return;
    }

    //Create thread for Broker Client that forwards logs to itself and parses it
    //TODO: just integrate this into the BrokerClient class
    logger = zactor_new(&CentralBroker::logging_reactor_task, this);
    initialized = true;
}